

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O0

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(string *prop)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar5;
  allocator<char> local_241;
  value_type local_240;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_220;
  undefined1 local_218;
  allocator<char> local_209;
  value_type local_208;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1e8;
  undefined1 local_1e0;
  allocator<char> local_1d1;
  value_type local_1d0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b0;
  undefined1 local_1a8;
  allocator<char> local_199;
  value_type local_198;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_178;
  undefined1 local_170;
  allocator<char> local_161;
  value_type local_160;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_140;
  undefined1 local_138;
  allocator<char> local_129;
  value_type local_128;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_108;
  undefined1 local_100;
  allocator<char> local_f1;
  value_type local_f0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d0;
  undefined1 local_c8;
  allocator<char> local_b9;
  value_type local_b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_98;
  undefined1 local_90;
  allocator<char> local_81;
  value_type local_80;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_60;
  undefined1 local_58;
  allocator<char> local_39;
  value_type local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *prop_local;
  
  local_18 = prop;
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,11ul>(prop,(char (*) [11])0x79e717);
  if (bVar1) {
    prop_local._7_1_ = true;
  }
  else {
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>(local_18,(char (*) [2])0x7b85c5);
    if (bVar1) {
      prop_local._7_1_ = true;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      iVar2 = islower((int)*pcVar3);
      if (iVar2 == 0) {
        if ((WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_ == '\0')
           && (iVar2 = __cxa_guard_acquire(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)
                                            ::builtIns_abi_cxx11_), iVar2 != 0)) {
          std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::unordered_set(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                           builtIns_abi_cxx11_);
          __cxa_atexit(std::
                       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~unordered_set,
                       &WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                               builtIns_abi_cxx11_);
        }
        bVar1 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                         builtIns_abi_cxx11_);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"COMPATIBLE_INTERFACE_BOOL",&local_39);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_38);
          local_60._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_58 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_38);
          std::allocator<char>::~allocator(&local_39);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_81);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_80);
          local_98._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_90 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator(&local_81);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_b9);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_b8);
          local_d0._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_c8 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator(&local_b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"COMPATIBLE_INTERFACE_STRING",&local_f1);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_f0);
          local_108._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_100 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator(&local_f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"EXPORT_NAME",&local_129);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_128);
          local_140._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_138 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator(&local_129);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"IMPORTED",&local_161);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_160);
          local_178._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_170 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator(&local_161);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,"IMPORTED_GLOBAL",&local_199);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_198);
          local_1b0._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_1a8 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator(&local_199);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"MANUALLY_ADDED_DEPENDENCIES",&local_1d1);
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_1d0);
          local_1e8._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_1e0 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator(&local_1d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"NAME",&local_209)
          ;
          pVar5 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                            builtIns_abi_cxx11_,&local_208);
          local_220._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_218 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator(&local_209);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"TYPE",&local_241)
          ;
          std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
                   &local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator(&local_241);
        }
        sVar4 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                         builtIns_abi_cxx11_,local_18);
        if (sVar4 == 0) {
          bVar1 = std::operator==(local_18,"IMPORTED_CONFIGURATIONS");
          if ((((bVar1) || (bVar1 = std::operator==(local_18,"IMPORTED_LIBNAME"), bVar1)) ||
              (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                                 (local_18,(char (*) [18])"IMPORTED_LIBNAME_"), bVar1)) ||
             (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                                (local_18,(char (*) [21])"MAP_IMPORTED_CONFIG_"), bVar1)) {
            prop_local._7_1_ = true;
          }
          else {
            bVar1 = std::operator==(local_18,"NO_SYSTEM_FROM_IMPORTED");
            if (bVar1) {
              prop_local._7_1_ = true;
            }
            else {
              prop_local._7_1_ = false;
            }
          }
        }
        else {
          prop_local._7_1_ = true;
        }
      }
      else {
        prop_local._7_1_ = true;
      }
    }
  }
  return prop_local._7_1_;
}

Assistant:

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(
  const std::string& prop)
{
  if (cmHasLiteralPrefix(prop, "INTERFACE_")) {
    return true;
  }
  if (cmHasLiteralPrefix(prop, "_")) {
    return true;
  }
  if (std::islower(prop[0])) {
    return true;
  }
  static std::unordered_set<std::string> builtIns;
  if (builtIns.empty()) {
    builtIns.insert("COMPATIBLE_INTERFACE_BOOL");
    builtIns.insert("COMPATIBLE_INTERFACE_NUMBER_MAX");
    builtIns.insert("COMPATIBLE_INTERFACE_NUMBER_MIN");
    builtIns.insert("COMPATIBLE_INTERFACE_STRING");
    builtIns.insert("EXPORT_NAME");
    builtIns.insert("IMPORTED");
    builtIns.insert("IMPORTED_GLOBAL");
    builtIns.insert("MANUALLY_ADDED_DEPENDENCIES");
    builtIns.insert("NAME");
    builtIns.insert("TYPE");
  }

  if (builtIns.count(prop)) {
    return true;
  }

  if (prop == "IMPORTED_CONFIGURATIONS" || prop == "IMPORTED_LIBNAME" ||
      cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME_") ||
      cmHasLiteralPrefix(prop, "MAP_IMPORTED_CONFIG_")) {
    return true;
  }

  // This property should not be allowed but was incorrectly added in
  // CMake 3.8.  We can't remove it from the whitelist without breaking
  // projects that try to set it.  One day we could warn about this, but
  // for now silently accept it.
  if (prop == "NO_SYSTEM_FROM_IMPORTED") {
    return true;
  }

  return false;
}